

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::anon_unknown_8::SparseIndexNode::~SparseIndexNode(SparseIndexNode *this)

{
  SparseIndexNode *this_00;
  pointer ppSVar1;
  ulong uVar2;
  
  ppSVar1 = (this->children).
            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    uVar2 = 0;
    do {
      this_00 = ppSVar1[uVar2];
      if (this_00 != (SparseIndexNode *)0x0) {
        ~SparseIndexNode(this_00);
        operator_delete(this_00,0x20);
      }
      uVar2 = uVar2 + 1;
      ppSVar1 = (this->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->children).
                                   super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3))
    ;
  }
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->children).
                                  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
    return;
  }
  return;
}

Assistant:

~SparseIndexNode (void)
	{
		for (size_t ndx = 0; ndx < children.size(); ndx++)
			delete children[ndx];
	}